

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall
ON_Layer::CullPerViewportSettings(ON_Layer *this,int viewport_id_count,ON_UUID *viewport_id_list)

{
  ON__LayerPerViewSettings *pOVar1;
  ON_UUID *pOVar2;
  ON__LayerExtensions *this_00;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ON_UUID vp_id;
  
  this_00 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
  if (this_00 != (ON__LayerExtensions *)0x0) {
    if (viewport_id_count < 1) {
LAB_004dcea8:
      ON__LayerExtensions::DeleteViewportSettings
                (this,&this->m_extension_bits,(ON__LayerPerViewSettings *)0x0);
      return;
    }
    if (viewport_id_list != (ON_UUID *)0x0) {
      lVar4 = (long)(this_00->m_vp_settings).m_count;
LAB_004dce42:
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
      if (bVar5) {
        pOVar1 = (this_00->m_vp_settings).m_a + lVar4;
        pOVar2 = viewport_id_list + lVar4;
        auVar6[0] = -((char)pOVar2->Data1 == (char)(pOVar1->m_viewport_id).Data1);
        auVar6[1] = -(*(char *)((long)&pOVar2->Data1 + 1) ==
                     *(char *)((long)&(pOVar1->m_viewport_id).Data1 + 1));
        auVar6[2] = -(*(char *)((long)&pOVar2->Data1 + 2) ==
                     *(char *)((long)&(pOVar1->m_viewport_id).Data1 + 2));
        auVar6[3] = -(*(char *)((long)&pOVar2->Data1 + 3) ==
                     *(char *)((long)&(pOVar1->m_viewport_id).Data1 + 3));
        auVar6[4] = -((char)pOVar2->Data2 == (char)(pOVar1->m_viewport_id).Data2);
        auVar6[5] = -(*(char *)((long)&pOVar2->Data2 + 1) ==
                     *(char *)((long)&(pOVar1->m_viewport_id).Data2 + 1));
        auVar6[6] = -((char)pOVar2->Data3 == (char)(pOVar1->m_viewport_id).Data3);
        auVar6[7] = -(*(char *)((long)&pOVar2->Data3 + 1) ==
                     *(char *)((long)&(pOVar1->m_viewport_id).Data3 + 1));
        auVar6[8] = -(pOVar2->Data4[0] == (pOVar1->m_viewport_id).Data4[0]);
        auVar6[9] = -(pOVar2->Data4[1] == (pOVar1->m_viewport_id).Data4[1]);
        auVar6[10] = -(pOVar2->Data4[2] == (pOVar1->m_viewport_id).Data4[2]);
        auVar6[0xb] = -(pOVar2->Data4[3] == (pOVar1->m_viewport_id).Data4[3]);
        auVar6[0xc] = -(pOVar2->Data4[4] == (pOVar1->m_viewport_id).Data4[4]);
        auVar6[0xd] = -(pOVar2->Data4[5] == (pOVar1->m_viewport_id).Data4[5]);
        auVar6[0xe] = -(pOVar2->Data4[6] == (pOVar1->m_viewport_id).Data4[6]);
        auVar6[0xf] = -(pOVar2->Data4[7] == (pOVar1->m_viewport_id).Data4[7]);
        iVar3 = viewport_id_count + 1;
        do {
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            ON_SimpleArray<ON__LayerPerViewSettings>::Remove(&this_00->m_vp_settings,(int)lVar4);
            break;
          }
        } while ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar6[0xf] >> 7) << 0xf) != 0xffff);
        goto LAB_004dce42;
      }
      bVar5 = ON__LayerExtensions::IsEmpty(this_00);
      if (bVar5) goto LAB_004dcea8;
    }
  }
  return;
}

Assistant:

void ON_Layer::CullPerViewportSettings( int viewport_id_count, const ON_UUID* viewport_id_list )
{
  ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
  if ( 0 != ud )
  {
    if ( viewport_id_count <= 0 )
    {
      // delete all per viewport settings
      ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
      ud = 0;
    }
    else if ( viewport_id_count > 0 && 0 != viewport_id_list )
    {
      int i, j;
      for ( i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        const ON_UUID vp_id = ud->m_vp_settings[i].m_viewport_id;
        for ( j = 0; j < viewport_id_count; j++ )
        {
          if ( 0 == memcmp(&viewport_id_list[i],&vp_id,sizeof(vp_id)) )
            break;
        }
        if ( j >= viewport_id_count )
        {
          // ud->m_vp_settings[i].m_viewport_id is NOT in viewport_id_list[]
          ud->m_vp_settings.Remove(i);
        }
      }
      if ( ud->IsEmpty() )
      {
        // nothing useful in ud
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
}